

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O2

string * __thiscall
libsgp4::DateTime::ToString_abi_cxx11_(string *__return_storage_ptr__,DateTime *this)

{
  ostream *poVar1;
  ulong uVar2;
  int day;
  int month;
  int year;
  stringstream ss;
  long local_190 [2];
  undefined8 uStack_180;
  uint auStack_178 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  FromTicks(this,&year,&month,&day);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffff4f | 0x80;
  std::operator<<((ostream *)local_190,0x30);
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 4;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,year);
  std::operator<<(poVar1,"-");
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,month);
  std::operator<<(poVar1,"-");
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,day);
  std::operator<<(poVar1," ");
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_190,(int)((this->m_encoded % 86400000000) / 3600000000));
  std::operator<<(poVar1,":");
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_190,(int)((this->m_encoded % 3600000000) / 60000000));
  std::operator<<(poVar1,":");
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  uVar2 = this->m_encoded % 60000000;
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_190,
                      (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                           1000000));
  std::operator<<(poVar1,".");
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 6;
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)local_190,(int)(this->m_encoded % 1000000));
  std::operator<<(poVar1," UTC");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        int year;
        int month;
        int day;
        FromTicks(year, month, day);
        ss << std::right << std::setfill('0');
        ss << std::setw(4) << year << "-";
        ss << std::setw(2) << month << "-";
        ss << std::setw(2) << day << " ";
        ss << std::setw(2) << Hour() << ":";
        ss << std::setw(2) << Minute() << ":";
        ss << std::setw(2) << Second() << ".";
        ss << std::setw(6) << Microsecond() << " UTC";
        return ss.str();
    }